

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

double Col_FloatWordValue(Col_Word word)

{
  uint local_2c;
  uint local_28;
  uint local_24;
  FloatConvert c;
  Col_Word word_local;
  
  if (word == 0) {
    local_24 = 0;
  }
  else {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        local_2c = 0xffffffff;
      }
      else {
        local_2c = *(byte *)word & 0xfffffffe;
      }
      local_28 = local_2c;
    }
    else {
      local_28 = immediateWordTypes[word & 0x1f];
    }
    local_24 = local_28;
  }
  if (local_24 == 0xfffffffd) {
    word_local = word & 0xfffffffffffffffc;
  }
  else if ((local_24 == 2) && (*(short *)(word + 2) == 8)) {
    word_local = *(Col_Word *)(word + 0x10);
  }
  else {
    word_local = 0;
  }
  return (double)word_local;
}

Assistant:

double
Col_FloatWordValue(
    Col_Word word)  /*!< Floating point word to get value for. */
{
    switch (WORD_TYPE(word)) {
    case WORD_TYPE_SMALLFP: {
        FloatConvert c;
        return WORD_SMALLFP_VALUE(word, c);
    }

    case WORD_TYPE_WRAP:
        if (WORD_WRAP_TYPE(word) == COL_FLOAT) {
            return WORD_FPWRAP_VALUE(word);
        }
    }

    /*! @typecheck{COL_ERROR_FLOAT,word} */
    TYPECHECK(0, COL_ERROR_FLOAT, word);
    
    return 0.0;
}